

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O2

int cmp_mem_at_loc(char *file,int line,void *got,void *expected,size_t n,char *fmt,...)

{
  char in_AL;
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_d8 [48];
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (got != expected) {
    if (expected == (void *)0x0 || got == (void *)0x0) {
      args[0].reg_save_area = local_d8;
      args[0].overflow_arg_area = &stack0x00000008;
      args[0].gp_offset = 0x30;
      args[0].fp_offset = 0x30;
      vok_at_loc(file,line,0,fmt,args);
      pcVar2 = "not NULL";
      pcVar1 = "not NULL";
      if (got == (void *)0x0) {
        pcVar1 = "NULL";
      }
      diag("         got: %s",pcVar1);
      if (expected == (void *)0x0) {
        pcVar2 = "NULL";
      }
      diag("    expected: %s",pcVar2);
      return 0;
    }
    for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
      if (*(char *)((long)got + sVar3) != *(char *)((long)expected + sVar3)) {
        args[0].reg_save_area = local_d8;
        args[0].overflow_arg_area = &stack0x00000008;
        args[0].gp_offset = 0x30;
        args[0].fp_offset = 0x30;
        vok_at_loc(file,line,0,fmt,args);
        diag("    Difference starts at offset %d",sVar3);
        diag("         got: 0x%02x",(ulong)*(byte *)((long)got + sVar3));
        diag("    expected: 0x%02x",(ulong)*(byte *)((long)expected + sVar3));
        return 0;
      }
    }
  }
  args[0].reg_save_area = local_d8;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x30;
  args[0].fp_offset = 0x30;
  vok_at_loc(file,line,1,fmt,args);
  return 1;
}

Assistant:

int
cmp_mem_at_loc (const char *file, int line, const void *got,
                const void *expected, size_t n, const char *fmt, ...)
{
    size_t offset;
    int diff = find_mem_diff(got, expected, n, &offset);
    va_list args;
    va_start(args, fmt);
    vok_at_loc(file, line, !diff, fmt, args);
    va_end(args);
    if (diff == 1) {
        diag("    Difference starts at offset %d", offset);
        diag("         got: 0x%02x", ((const unsigned char *)got)[offset]);
        diag("    expected: 0x%02x", ((const unsigned char *)expected)[offset]);
    }
    else if (diff == 2) {
        diag("         got: %s", got ? "not NULL" : "NULL");
        diag("    expected: %s", expected ? "not NULL" : "NULL");
    }
    return !diff;
}